

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# w3interp.cpp
# Opt level: O2

void __thiscall w3Interp::Copysign_f64(w3Interp *this)

{
  double *pdVar1;
  double dVar2;
  double dVar3;
  
  dVar2 = w3Stack::pop_f64(&this->super_w3Stack);
  pdVar1 = w3Stack::f64(&this->super_w3Stack);
  dVar3 = *pdVar1;
  if (0.0 <= dVar3 == dVar2 < 0.0) {
    dVar3 = -dVar3;
  }
  *pdVar1 = dVar3;
  return;
}

Assistant:

INTERP (Copysign_f64)
{
    const double z2 = pop_f64 ();
    double& z1 = f64 ();
    z1 = ((z2 < 0) != (z1 < 0)) ? -z1 : z1;
}